

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O1

void mxx::
     bitonic_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
               (int *begin,int *end,comm *param_3)

{
  long lVar1;
  unsigned_long uVar2;
  int *piVar3;
  runtime_error *this;
  ulong uVar4;
  int result;
  int i;
  size_t np;
  int local_38;
  uint local_34;
  unsigned_long local_30;
  
  uVar4 = (long)end - (long)begin >> 3;
  local_30 = uVar4;
  uVar2 = right_shift<unsigned_long>(&local_30,param_3);
  local_34 = (uint)(uVar2 == local_30 || param_3->m_rank == 0);
  MPI_Allreduce(&local_34,&local_38,1,&ompi_mpi_int,&ompi_mpi_op_land,param_3->mpi_comm);
  if (local_38 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"bitonic sort only works for the same number of elements on each process.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar3 = end;
  if (begin != end) {
    for (piVar3 = begin + 2; piVar3 != end; piVar3 = piVar3 + 2) {
      if ((*piVar3 < piVar3[-2]) || ((*piVar3 <= piVar3[-2] && (piVar3[1] < piVar3[-1])))) break;
    }
  }
  if (piVar3 != end && begin != end) {
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,int>>>>
              (begin,end,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,int>>>>
              (begin,end);
  }
  impl::
  bitonic_sort_rec<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (begin,end,param_3,0,param_3->m_size,0);
  return;
}

Assistant:

void bitonic_sort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm) {
    size_t np = std::distance(begin, end);
    if (!mxx::all_same(np, comm)) {
        throw std::runtime_error("bitonic sort only works for the same number of elements on each process.");
    }

    if (!std::is_sorted(begin, end, comp)) {
        // sort local elements first
        std::sort(begin, end, comp);
    }

    // recursively sort via bitonic sort
    impl::bitonic_sort_rec(begin, end, comp, comm, 0, comm.size(), impl::asc);
}